

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCyclic.cpp
# Opt level: O0

void __thiscall SimpleCyclic::Cyclic::~Cyclic(Cyclic *this)

{
  char *pcVar1;
  ostream *poVar2;
  Cyclic *this_local;
  
  pcVar1 = std::type_info::name((type_info *)&typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,"::");
  poVar2 = std::operator<<(poVar2,"~Cyclic");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::function<void_()>::~function(&this->_fn);
  std::enable_shared_from_this<SimpleCyclic::Cyclic>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<SimpleCyclic::Cyclic>);
  return;
}

Assistant:

Cyclic::~Cyclic()
{
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}